

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Option<unsigned_long> __thiscall Catch::list(Catch *this,Config *config)

{
  size_t sVar1;
  char in_RDX [8];
  char extraout_RDX [8];
  char extraout_RDX_00 [8];
  char extraout_RDX_01 [8];
  char extraout_RDX_02 [8];
  long lVar2;
  Option<unsigned_long> OVar3;
  
  *(undefined8 *)this = 0;
  if ((config->m_data).listTests == true) {
    sVar1 = listTests(config);
    *(size_t *)(this + 8) = sVar1;
    *(Catch **)this = this + 8;
    in_RDX = extraout_RDX;
    if ((config->m_data).listTestNamesOnly != false) {
      lVar2 = *(long *)(this + 8);
LAB_0011e963:
      sVar1 = listTestsNamesOnly(config);
      *(size_t *)(this + 8) = sVar1 + lVar2;
      *(Catch **)this = this + 8;
      in_RDX = extraout_RDX_00;
    }
    if ((config->m_data).listTags != false) {
      lVar2 = *(long *)(this + 8);
LAB_0011e98f:
      sVar1 = listTags(config);
      *(size_t *)(this + 8) = sVar1 + lVar2;
      *(Catch **)this = this + 8;
      in_RDX = extraout_RDX_01;
    }
    if ((config->m_data).listReporters == false) goto LAB_0011e9c5;
    lVar2 = *(long *)(this + 8);
  }
  else {
    if ((config->m_data).listTestNamesOnly != false) {
      lVar2 = 0;
      goto LAB_0011e963;
    }
    if ((config->m_data).listTags != false) {
      lVar2 = 0;
      goto LAB_0011e98f;
    }
    if ((config->m_data).listReporters == false) goto LAB_0011e9c5;
    lVar2 = 0;
  }
  sVar1 = listReporters(config);
  *(size_t *)(this + 8) = sVar1 + lVar2;
  *(Catch **)this = this + 8;
  in_RDX = extraout_RDX_02;
LAB_0011e9c5:
  OVar3.storage[0] = in_RDX[0];
  OVar3.storage[1] = in_RDX[1];
  OVar3.storage[2] = in_RDX[2];
  OVar3.storage[3] = in_RDX[3];
  OVar3.storage[4] = in_RDX[4];
  OVar3.storage[5] = in_RDX[5];
  OVar3.storage[6] = in_RDX[6];
  OVar3.storage[7] = in_RDX[7];
  OVar3.nullableValue = (unsigned_long *)this;
  return OVar3;
}

Assistant:

inline Option<std::size_t> list( Config const& config ) {
        Option<std::size_t> listedCount;
        if( config.listTests() )
            listedCount = listedCount.valueOr(0) + listTests( config );
        if( config.listTestNamesOnly() )
            listedCount = listedCount.valueOr(0) + listTestsNamesOnly( config );
        if( config.listTags() )
            listedCount = listedCount.valueOr(0) + listTags( config );
        if( config.listReporters() )
            listedCount = listedCount.valueOr(0) + listReporters( config );
        return listedCount;
    }